

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_future.c
# Opt level: O0

future_return
future_await(future_conflict f,future_resolve_callback resolve_callback,
            future_reject_callback reject_callback,void *context)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  future_return local_8;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RDI[1] == 0)) || (*(long *)(in_RDI[1] + 8) == 0)) {
    local_8 = (future_return)0x0;
  }
  else {
    local_8 = (future_return)(**(code **)(in_RDI[1] + 8))(in_RDI,*in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_8;
}

Assistant:

future_return future_await(future f, future_resolve_callback resolve_callback, future_reject_callback reject_callback, void *context)
{
	if (f != NULL)
	{
		if (f->interface != NULL && f->interface->await != NULL)
		{
			/* TODO: Disable logs here until log is completely thread safe and async signal safe */

			/*
			log_write("metacall", LOG_LEVEL_DEBUG, "Await future (%p)", (void *)f);
			*/

			return f->interface->await(f, f->impl, resolve_callback, reject_callback, context);
		}
	}

	return NULL;
}